

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::number_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this)

{
  int x;
  AlphaNum *a;
  AlphaNum local_48;
  FieldGeneratorBase *local_18;
  FieldGeneratorBase *this_local;
  
  local_18 = this;
  this_local = (FieldGeneratorBase *)__return_storage_ptr__;
  x = FieldDescriptor::number(this->descriptor_);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_48,x);
  absl::lts_20250127::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_48,a);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::number() {
  return absl::StrCat(descriptor_->number());
}